

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::ParsedScene::AttributeBegin(ParsedScene *this,FileLoc loc)

{
  pointer *ppTVar1;
  pointer *pppVar2;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  string local_30;
  
  if (this->currentApiState == OptionsBlock) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_allocated_capacity =
         (ulong)(uint7)local_30.field_2._M_allocated_capacity._1_7_ << 8;
    detail::stringPrintfRecursive<char_const(&)[15]>
              (&local_30,
               "Scene description must be inside world block; \"%s\" not allowed. Ignoring.",
               (char (*) [15])0x4b9fe0);
    Error(&loc,local_30._M_dataplus._M_p);
  }
  else {
    if (this->currentApiState != Uninitialized) {
      std::
      vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>::
      push_back(&this->pushedGraphicsStates,this->graphicsState);
      __position._M_current =
           (this->pushedTransforms).
           super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->pushedTransforms).
          super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<pbrt::TransformSet,std::allocator<pbrt::TransformSet>>::
        _M_realloc_insert<pbrt::TransformSet_const&>
                  ((vector<pbrt::TransformSet,std::allocator<pbrt::TransformSet>> *)
                   &this->pushedTransforms,__position,&this->curTransform);
      }
      else {
        uVar3 = *(undefined8 *)(this->curTransform).t[0].m.m[0];
        uVar4 = *(undefined8 *)((this->curTransform).t[0].m.m[0] + 2);
        uVar5 = *(undefined8 *)(this->curTransform).t[0].m.m[1];
        uVar6 = *(undefined8 *)((this->curTransform).t[0].m.m[1] + 2);
        uVar7 = *(undefined8 *)(this->curTransform).t[0].m.m[2];
        uVar8 = *(undefined8 *)((this->curTransform).t[0].m.m[2] + 2);
        uVar9 = *(undefined8 *)(this->curTransform).t[0].m.m[3];
        uVar10 = *(undefined8 *)((this->curTransform).t[0].m.m[3] + 2);
        uVar11 = *(undefined8 *)(this->curTransform).t[0].mInv.m[0];
        uVar12 = *(undefined8 *)((this->curTransform).t[0].mInv.m[0] + 2);
        uVar13 = *(undefined8 *)(this->curTransform).t[0].mInv.m[1];
        uVar14 = *(undefined8 *)((this->curTransform).t[0].mInv.m[1] + 2);
        uVar15 = *(undefined8 *)(this->curTransform).t[0].mInv.m[2];
        uVar16 = *(undefined8 *)((this->curTransform).t[0].mInv.m[2] + 2);
        uVar17 = *(undefined8 *)(this->curTransform).t[0].mInv.m[3];
        uVar18 = *(undefined8 *)((this->curTransform).t[0].mInv.m[3] + 2);
        uVar19 = *(undefined8 *)(this->curTransform).t[1].m.m[0];
        uVar20 = *(undefined8 *)((this->curTransform).t[1].m.m[0] + 2);
        uVar21 = *(undefined8 *)(this->curTransform).t[1].m.m[1];
        uVar22 = *(undefined8 *)((this->curTransform).t[1].m.m[1] + 2);
        uVar23 = *(undefined8 *)(this->curTransform).t[1].m.m[2];
        uVar24 = *(undefined8 *)((this->curTransform).t[1].m.m[2] + 2);
        uVar25 = *(undefined8 *)(this->curTransform).t[1].m.m[3];
        uVar26 = *(undefined8 *)((this->curTransform).t[1].m.m[3] + 2);
        uVar27 = *(undefined8 *)((this->curTransform).t[1].mInv.m[0] + 2);
        uVar28 = *(undefined8 *)(this->curTransform).t[1].mInv.m[1];
        uVar29 = *(undefined8 *)((this->curTransform).t[1].mInv.m[1] + 2);
        uVar30 = *(undefined8 *)(this->curTransform).t[1].mInv.m[2];
        uVar31 = *(undefined8 *)((this->curTransform).t[1].mInv.m[2] + 2);
        uVar32 = *(undefined8 *)(this->curTransform).t[1].mInv.m[3];
        uVar33 = *(undefined8 *)((this->curTransform).t[1].mInv.m[3] + 2);
        *(undefined8 *)(__position._M_current)->t[1].mInv.m[0] =
             *(undefined8 *)(this->curTransform).t[1].mInv.m[0];
        *(undefined8 *)((__position._M_current)->t[1].mInv.m[0] + 2) = uVar27;
        *(undefined8 *)(__position._M_current)->t[1].mInv.m[1] = uVar28;
        *(undefined8 *)((__position._M_current)->t[1].mInv.m[1] + 2) = uVar29;
        *(undefined8 *)(__position._M_current)->t[1].mInv.m[2] = uVar30;
        *(undefined8 *)((__position._M_current)->t[1].mInv.m[2] + 2) = uVar31;
        *(undefined8 *)(__position._M_current)->t[1].mInv.m[3] = uVar32;
        *(undefined8 *)((__position._M_current)->t[1].mInv.m[3] + 2) = uVar33;
        *(undefined8 *)(__position._M_current)->t[1].m.m[0] = uVar19;
        *(undefined8 *)((__position._M_current)->t[1].m.m[0] + 2) = uVar20;
        *(undefined8 *)(__position._M_current)->t[1].m.m[1] = uVar21;
        *(undefined8 *)((__position._M_current)->t[1].m.m[1] + 2) = uVar22;
        *(undefined8 *)(__position._M_current)->t[1].m.m[2] = uVar23;
        *(undefined8 *)((__position._M_current)->t[1].m.m[2] + 2) = uVar24;
        *(undefined8 *)(__position._M_current)->t[1].m.m[3] = uVar25;
        *(undefined8 *)((__position._M_current)->t[1].m.m[3] + 2) = uVar26;
        *(undefined8 *)(__position._M_current)->t[0].mInv.m[0] = uVar11;
        *(undefined8 *)((__position._M_current)->t[0].mInv.m[0] + 2) = uVar12;
        *(undefined8 *)(__position._M_current)->t[0].mInv.m[1] = uVar13;
        *(undefined8 *)((__position._M_current)->t[0].mInv.m[1] + 2) = uVar14;
        *(undefined8 *)(__position._M_current)->t[0].mInv.m[2] = uVar15;
        *(undefined8 *)((__position._M_current)->t[0].mInv.m[2] + 2) = uVar16;
        *(undefined8 *)(__position._M_current)->t[0].mInv.m[3] = uVar17;
        *(undefined8 *)((__position._M_current)->t[0].mInv.m[3] + 2) = uVar18;
        *(undefined8 *)(__position._M_current)->t[0].m.m[0] = uVar3;
        *(undefined8 *)((__position._M_current)->t[0].m.m[0] + 2) = uVar4;
        *(undefined8 *)(__position._M_current)->t[0].m.m[1] = uVar5;
        *(undefined8 *)((__position._M_current)->t[0].m.m[1] + 2) = uVar6;
        *(undefined8 *)(__position._M_current)->t[0].m.m[2] = uVar7;
        *(undefined8 *)((__position._M_current)->t[0].m.m[2] + 2) = uVar8;
        *(undefined8 *)(__position._M_current)->t[0].m.m[3] = uVar9;
        *(undefined8 *)((__position._M_current)->t[0].m.m[3] + 2) = uVar10;
        ppTVar1 = &(this->pushedTransforms).
                   super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      __position_00._M_current =
           (this->pushedActiveTransformBits).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->pushedActiveTransformBits).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &this->pushedActiveTransformBits,__position_00,&this->activeTransformBits);
      }
      else {
        *__position_00._M_current = this->activeTransformBits;
        (this->pushedActiveTransformBits).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      local_30._M_dataplus._M_p._0_1_ = 0x61;
      local_30.field_2._8_4_ = loc.line;
      local_30.field_2._12_4_ = loc.column;
      local_30._M_string_length = loc.filename._M_len;
      local_30.field_2._M_allocated_capacity = (size_type)loc.filename._M_str;
      __position_01._M_current =
           (this->pushStack).
           super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_01._M_current !=
          (this->pushStack).
          super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        *(pointer *)__position_01._M_current = local_30._M_dataplus._M_p;
        ((__position_01._M_current)->second).filename._M_len = loc.filename._M_len;
        ((__position_01._M_current)->second).filename._M_str = loc.filename._M_str;
        ((__position_01._M_current)->second).line = loc.line;
        ((__position_01._M_current)->second).column = loc.column;
        pppVar2 = &(this->pushStack).
                   super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar2 = *pppVar2 + 1;
        return;
      }
      std::vector<std::pair<char,pbrt::FileLoc>,std::allocator<std::pair<char,pbrt::FileLoc>>>::
      _M_realloc_insert<std::pair<char,pbrt::FileLoc>>
                ((vector<std::pair<char,pbrt::FileLoc>,std::allocator<std::pair<char,pbrt::FileLoc>>>
                  *)&this->pushStack,__position_01,(pair<char,_pbrt::FileLoc> *)&local_30);
      return;
    }
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_allocated_capacity =
         (ulong)(uint7)local_30.field_2._M_allocated_capacity._1_7_ << 8;
    detail::stringPrintfRecursive<char_const(&)[15]>
              (&local_30,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [15])0x4b9fe0);
    Error(&loc,local_30._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ParsedScene::AttributeBegin(FileLoc loc) {
    VERIFY_WORLD("AttributeBegin");

    pushedGraphicsStates.push_back(*graphicsState);

    pushedTransforms.push_back(curTransform);
    pushedActiveTransformBits.push_back(activeTransformBits);

    pushStack.push_back(std::make_pair('a', loc));
}